

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O2

TheoryTerm * __thiscall
Potassco::TheoryData::addTerm(TheoryData *this,Id_t termId,Id_t funcId,IdSpan *args)

{
  FuncData *c;
  TheoryTerm *pTVar1;
  TheoryTerm local_20;
  
  c = FuncData::newFunc(funcId,args);
  TheoryTerm::TheoryTerm(&local_20,c);
  pTVar1 = setTerm(this,termId);
  pTVar1->data_ = local_20.data_;
  return pTVar1;
}

Assistant:

const TheoryTerm& TheoryData::addTerm(Id_t termId, Id_t funcId, const IdSpan& args) {
	return setTerm(termId) = TheoryTerm(FuncData::newFunc(static_cast<int32_t>(funcId), args));
}